

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

uint32 heap32b_extr_top(float32 *out_a,uint32 *out_k,float32 *a,uint32 *k,uint32 sz,hcmpfn32b_t cmp)

{
  uint32 sz_00;
  
  if (sz == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/heap.c"
            ,0x99,"Heap underflow\n");
    sz_00 = 0xffffffff;
  }
  else {
    *out_a = *a;
    *out_k = *k;
    sz_00 = sz - 1;
    *a = a[sz_00];
    *k = k[sz_00];
    heapify32b(a,k,0,sz_00,cmp);
  }
  return sz_00;
}

Assistant:

uint32
heap32b_extr_top(float32 *out_a,
		 uint32 *out_k,
		 float32 *a, uint32 *k, uint32 sz,
		 hcmpfn32b_t cmp)
{
    if (sz < 1) {
	E_ERROR("Heap underflow\n");
	return NO_KEY;
    }

    *out_a = a[0];
    *out_k = k[0];

    a[0] = a[sz-1];
    k[0] = k[sz-1];

    sz--;

    heapify32b(a, k, 0, sz, cmp);

    return sz;
}